

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

_Bool apx_allocator_processEvent(apx_allocator_t *self)

{
  bool bVar1;
  void *pvStack_28;
  _Bool delayedFree;
  rbf_data_t data;
  uint8_t rc;
  _Bool retval;
  apx_allocator_t *self_local;
  
  data._15_1_ = 1;
  bVar1 = false;
  pthread_spin_lock(&self->lock);
  data._14_1_ = adt_rbfh_remove(&self->messages,(uint8_t *)&stack0xffffffffffffffd8);
  if (data._14_1_ == '\0') {
    if (pvStack_28 == (void *)0x0) {
      data._15_1_ = 0;
    }
    else {
      bVar1 = 0x20 < (uint)data.ptr;
      if (!bVar1) {
        soa_free(&self->soa,pvStack_28,(ulong)(uint)data.ptr);
      }
    }
  }
  else {
    data._15_1_ = 0;
  }
  pthread_spin_unlock(&self->lock);
  if (bVar1) {
    free(pvStack_28);
  }
  else if ((data._14_1_ == '\0') && (pvStack_28 == (void *)0x0)) {
    data._15_1_ = 0;
  }
  return (_Bool)(data._15_1_ & 1);
}

Assistant:

static bool apx_allocator_processEvent(apx_allocator_t *self)
{
   bool retval = true;
   uint8_t rc;
   rbf_data_t data;
   bool delayedFree = false;
   SPINLOCK_ENTER(self->lock);
   rc = adt_rbfh_remove(&self->messages,(uint8_t*) &data);
   if (rc == BUF_E_OK)
   {
      if (data.ptr != 0)
      {
         if (data.size<=SOA_SMALL_OBJECT_MAX_SIZE)
         {
            soa_free(&self->soa,data.ptr,data.size);
         }
         else
         {
            delayedFree = true;
         }
      }
      else
      {
         retval = false;
      }
   }
   else
   {
      retval = false;
   }
   SPINLOCK_LEAVE(self->lock);

   if (delayedFree == true)
   {
      free(data.ptr);
   }
   else if ( (rc == BUF_E_OK) && (data.ptr == 0) )
   {
      retval = false; //NULL data pointer is a valid exit message
   }
   else
   {
      //Already handled by soa_free or bufResult != E_BUF_OK
   }
   return retval;
}